

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_create(char *filename,int *handle)

{
  int status;
  int *handle_local;
  char *filename_local;
  
  filename_local._4_4_ = mem_createmem(0xb40,handle);
  if (filename_local._4_4_ == 0) {
    filename_local._4_4_ = 0;
  }
  else {
    ffpmsg("failed to create empty memory file (mem_create)");
  }
  return filename_local._4_4_;
}

Assistant:

int mem_create(char *filename, int *handle)
/*
  Create a new empty memory file for subsequent writes.
  The file name is ignored in this case.
*/
{
    int status;

    /* initially allocate 1 FITS block = 2880 bytes */
    status = mem_createmem(2880L, handle);

    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_create)");
        return(status);
    }

    return(0);
}